

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error stream_write(cio_io_stream *stream,cio_write_buffer *buffer,
                      cio_io_stream_write_handler_t handler,void *handler_context)

{
  int __fd;
  cio_eventloop *loop;
  iovec *piVar1;
  size_t sVar2;
  int *piVar3;
  long lStack_b8;
  long *local_b0;
  bool local_a5;
  size_t local_a0;
  ssize_t ret;
  size_t i;
  cio_write_buffer *write_buffer;
  msghdr msg;
  unsigned_long __vla_expr0;
  size_t chain_length;
  cio_socket *socket;
  void *handler_context_local;
  cio_io_stream_write_handler_t handler_local;
  cio_write_buffer *buffer_local;
  cio_io_stream *stream_local;
  
  local_a5 = true;
  if ((stream != (cio_io_stream *)0x0) && (local_a5 = true, buffer != (cio_write_buffer *)0x0)) {
    local_a5 = handler == (cio_io_stream_write_handler_t)0x0;
  }
  if (local_a5 == false) {
    piVar1 = (iovec *)cio_write_buffer_get_num_buffer_elements(buffer);
    local_b0 = &lStack_b8 + (long)piVar1 * -2;
    write_buffer = (cio_write_buffer *)0x0;
    msg.msg_name._0_4_ = 0;
    msg.msg_iovlen = 0;
    msg.msg_control = (void *)0x0;
    msg.msg_controllen._0_4_ = 0;
    i = (size_t)buffer->next;
    for (ret = 0; (ulong)ret < piVar1; ret = ret + 1) {
      local_b0[ret * 2] = *(long *)(i + 0x10);
      local_b0[ret * 2 + 1] = *(long *)(i + 0x18);
      i = *(size_t *)i;
    }
    __fd = *(int *)&stream[1].write_handler;
    msg._8_8_ = local_b0;
    msg.msg_iov = piVar1;
    msg._48_8_ = piVar1;
    (&lStack_b8)[(long)piVar1 * -2 + -1] = 0x104709;
    sVar2 = sendmsg(__fd,(msghdr *)&write_buffer,0x4000);
    local_a0 = sVar2;
    if ((long)sVar2 < 0) {
      (&lStack_b8)[(long)piVar1 * -2 + -1] = 0x10474d;
      piVar3 = __errno_location();
      if (*piVar3 == 0xb) {
        stream->write_handler = handler;
        stream->write_handler_context = handler_context;
        stream->write_buffer = buffer;
        stream[1].write_buffer = (cio_write_buffer *)stream;
        stream[1].read_buffer = (cio_read_buffer *)write_callback;
        loop = (cio_eventloop *)stream[2].write_handler;
        (&lStack_b8)[(long)piVar1 * -2 + -1] = 0x1047bb;
        stream_local._4_4_ =
             cio_linux_eventloop_register_write
                       (loop,(cio_event_notifier *)&stream[1].read_handler_context);
      }
      else {
        (&lStack_b8)[(long)piVar1 * -2 + -1] = 0x1047cf;
        piVar3 = __errno_location();
        stream_local._4_4_ = -*piVar3;
      }
    }
    else {
      (&lStack_b8)[(long)piVar1 * -2 + -1] = 0x104743;
      (*handler)(stream,handler_context,buffer,CIO_SUCCESS,sVar2);
      stream_local._4_4_ = CIO_SUCCESS;
    }
  }
  else {
    stream_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  return stream_local._4_4_;
}

Assistant:

static enum cio_error stream_write(struct cio_io_stream *stream, struct cio_write_buffer *buffer, cio_io_stream_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_socket *socket = cio_container_of(stream, struct cio_socket, stream);
	size_t chain_length = cio_write_buffer_get_num_buffer_elements(buffer);
	struct iovec msg_iov[chain_length];
	struct msghdr msg;
	msg.msg_name = NULL;
	msg.msg_namelen = 0;
	msg.msg_control = NULL;
	msg.msg_controllen = 0;
	msg.msg_flags = 0;
	msg.msg_iov = msg_iov;
	msg.msg_iovlen = chain_length;

	const struct cio_write_buffer *write_buffer = buffer->next;
	for (size_t i = 0; i < chain_length; i++) {
		msg_iov[i].iov_base = write_buffer->data.element.data;
		msg_iov[i].iov_len = write_buffer->data.element.length;
		write_buffer = write_buffer->next;
	}

	ssize_t ret = sendmsg(socket->impl.ev.fd, &msg, MSG_NOSIGNAL);
	if (cio_likely(ret >= 0)) {
		handler(stream, handler_context, buffer, CIO_SUCCESS, (size_t)ret);
	} else {
		if (cio_likely(errno == EAGAIN)) {
			socket->stream.write_handler = handler;
			socket->stream.write_handler_context = handler_context;
			socket->stream.write_buffer = buffer;
			socket->impl.ev.context = stream;
			socket->impl.ev.write_callback = write_callback;
			return cio_linux_eventloop_register_write(socket->impl.loop, &socket->impl.ev);
		}

		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}